

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O0

Vector3d *
sdf::SDFGradient(Vector3d *location,
                vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives)

{
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RSI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  double *scalar;
  double delta;
  EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffd18;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  Scalar *in_stack_fffffffffffffd38;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *z;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd40;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd48;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffffd50;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_01;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *in_stack_fffffffffffffdf8;
  Vector3d *in_stack_fffffffffffffe00;
  
  this_00 = in_RSI;
  this_01 = in_RDI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd50,(Scalar *)in_stack_fffffffffffffd48,
             (Scalar *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffd18);
  SDF(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd50,(Scalar *)in_stack_fffffffffffffd48,
             (Scalar *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffd18);
  SDF(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  z = in_RSI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd50,(Scalar *)in_stack_fffffffffffffd48,
             (Scalar *)in_stack_fffffffffffffd40,(Scalar *)in_RSI);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
            (in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffd18);
  this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         SDF(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  other = in_RSI;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd50,(Scalar *)this,(Scalar *)in_RSI,(Scalar *)z);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(this,other);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffd18);
  SDF(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,(Scalar *)this,(Scalar *)other,(Scalar *)z);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+(this,other);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffd18);
  scalar = (double *)SDF(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,(Scalar *)this,(Scalar *)other,(Scalar *)z);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-(this,other);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffd18);
  SDF(in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RSI,(Scalar *)this,(Scalar *)other,(Scalar *)z);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/(this_01,scalar);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)this_00,in_stack_fffffffffffffd18);
  return (Vector3d *)in_RDI;
}

Assistant:

Eigen::Vector3d 
  SDFGradient(const Eigen::Vector3d &location,  std::vector<Primitive*> &primitives)
  {
    double delta=1e-05;
    return Eigen::Vector3d(
           SDF(location + Eigen::Vector3d(delta,0,0), primitives) - SDF(location - Eigen::Vector3d(delta,0,0), primitives),
           SDF(location + Eigen::Vector3d(0,delta,0), primitives) - SDF(location - Eigen::Vector3d(0,delta,0), primitives),
           SDF(location + Eigen::Vector3d(0,0,delta), primitives) - SDF(location - Eigen::Vector3d(0,0,delta), primitives))/(2.0*delta);
  }